

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__hdr_test_core(stbi__context *s)

{
  byte bVar1;
  int local_24;
  int i;
  char *signature;
  stbi__context *s_local;
  
  local_24 = 0;
  while( true ) {
    if ("#?RADIANCE\n"[local_24] == '\0') {
      return 1;
    }
    bVar1 = stbi__get8(s);
    if ((uint)bVar1 != (int)"#?RADIANCE\n"[local_24]) break;
    local_24 = local_24 + 1;
  }
  return 0;
}

Assistant:

static int stbi__hdr_test_core(stbi__context *s)
{
   const char *signature = "#?RADIANCE\n";
   int i;
   for (i=0; signature[i]; ++i)
      if (stbi__get8(s) != signature[i])
         return 0;
   return 1;
}